

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O1

void __thiscall
iu_AssertionTest_x_iutest_x_STRIN_Test::Body(iu_AssertionTest_x_iutest_x_STRIN_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionResult iutest_ar;
  char test [5];
  string str;
  allocator<char> local_221;
  AssertionResult local_220;
  char local_1f8 [4];
  char local_1f4;
  AssertionHelper local_1f0;
  long *local_1c0 [2];
  long local_1b0 [2];
  undefined1 local_1a0 [392];
  
  local_1f4 = '\0';
  builtin_strncpy(local_1f8,"test",4);
  local_1c0[0] = local_1b0;
  sVar2 = strlen(local_1f8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,&local_1f8,local_1f8 + sVar2);
  iuutil::StrInHelper::Assertion<char[4],char[5]>
            (&local_220,(StrInHelper *)"\"tes\"","test","tes",&local_1f8,(char (*) [5])in_R9);
  if (local_220.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,local_220.m_message._M_dataplus._M_p,&local_221);
    local_1f0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x13a;
    local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_message._M_dataplus._M_p == &local_220.m_message.field_2) goto LAB_0013b649;
  }
  else {
    paVar1 = &local_220.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_220.m_message._M_dataplus._M_p,
                      local_220.m_message.field_2._M_allocated_capacity + 1);
    }
    iuutil::StrInHelper::Assertion<char[4],char[5]>
              (&local_220,(StrInHelper *)"\"tes\"","test","tes",&local_1f8,(char (*) [5])in_R9);
    if (local_220.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,local_220.m_message._M_dataplus._M_p,&local_221);
      local_1f0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
      ;
      local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x13b;
      local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_220.m_message._M_dataplus._M_p,
                      local_220.m_message.field_2._M_allocated_capacity + 1);
    }
    iuutil::StrInHelper::Assertion<char[4],char[5]>
              (&local_220,(StrInHelper *)"\"tes\"","test","tes",&local_1f8,(char (*) [5])in_R9);
    if (local_220.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,local_220.m_message._M_dataplus._M_p,&local_221);
      local_1f0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
      ;
      local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x13c;
      local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_220.m_message._M_dataplus._M_p,
                      local_220.m_message.field_2._M_allocated_capacity + 1);
    }
    iuutil::StrInHelper::Assertion<char[4],char[5]>
              (&local_220,(StrInHelper *)"\"tes\"","test","tes",&local_1f8,(char (*) [5])in_R9);
    if (local_220.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,local_220.m_message._M_dataplus._M_p,&local_221);
      local_1f0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
      ;
      local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x13d;
      local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)local_1a0,false);
LAB_0013b7f9:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_220.m_message._M_dataplus._M_p,
                        local_220.m_message.field_2._M_allocated_capacity + 1);
      }
      iuutil::StrInHelper::Assertion<char[5],char[5]>
                (&local_220,(StrInHelper *)"\"test\"","test","test",(char (*) [5])local_1f8,
                 (char (*) [5])in_R9);
      if (local_220.m_result == false) {
        memset((iu_global_format_stringstream *)local_1a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,local_220.m_message._M_dataplus._M_p,&local_221);
        local_1f0.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
        ;
        local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x13f;
        local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 2;
        iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)local_1a0,false);
        goto LAB_0013b7f9;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_220.m_message._M_dataplus._M_p,
                        local_220.m_message.field_2._M_allocated_capacity + 1);
      }
      iuutil::StrInHelper::Assertion<char[5],char[5]>
                (&local_220,(StrInHelper *)"\"test\"","test","test",(char (*) [5])local_1f8,
                 (char (*) [5])in_R9);
      if (local_220.m_result == false) {
        memset((iu_global_format_stringstream *)local_1a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,local_220.m_message._M_dataplus._M_p,&local_221);
        local_1f0.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
        ;
        local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x140;
        local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 1;
        iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)local_1a0,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
            &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
        std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_220.m_message._M_dataplus._M_p,
                        local_220.m_message.field_2._M_allocated_capacity + 1);
      }
      iuutil::StrInHelper::Assertion<char[5],char[5]>
                (&local_220,(StrInHelper *)"\"test\"","test","test",(char (*) [5])local_1f8,
                 (char (*) [5])in_R9);
      if (local_220.m_result == false) {
        memset((iu_global_format_stringstream *)local_1a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,local_220.m_message._M_dataplus._M_p,&local_221);
        local_1f0.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
        ;
        local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x141;
        local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
        iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)local_1a0,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
            &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
        std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_220.m_message._M_dataplus._M_p,
                        local_220.m_message.field_2._M_allocated_capacity + 1);
      }
      iuutil::StrInHelper::Assertion<char[5],char[5]>
                (&local_220,(StrInHelper *)"\"test\"","test","test",(char (*) [5])local_1f8,
                 (char (*) [5])in_R9);
      if (local_220.m_result == false) {
        memset((iu_global_format_stringstream *)local_1a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,local_220.m_message._M_dataplus._M_p,&local_221);
        local_1f0.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
        ;
        local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x142;
        local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
        iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)local_1a0,false);
        goto LAB_0013b7f9;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_220.m_message._M_dataplus._M_p,
                        local_220.m_message.field_2._M_allocated_capacity + 1);
      }
      iuutil::StrInHelper::Assertion<char[4],std::__cxx11::string>
                (&local_220,(StrInHelper *)"\"tes\"","str","tes",(char (*) [4])local_1c0,in_R9);
      if (local_220.m_result == false) {
        memset((iu_global_format_stringstream *)local_1a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,local_220.m_message._M_dataplus._M_p,&local_221);
        local_1f0.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
        ;
        local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x144;
        local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 2;
        iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)local_1a0,false);
        goto LAB_0013b7f9;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_220.m_message._M_dataplus._M_p,
                        local_220.m_message.field_2._M_allocated_capacity + 1);
      }
      iuutil::StrInHelper::Assertion<char[4],std::__cxx11::string>
                (&local_220,(StrInHelper *)"\"tes\"","str","tes",(char (*) [4])local_1c0,in_R9);
      if (local_220.m_result == false) {
        memset((iu_global_format_stringstream *)local_1a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,local_220.m_message._M_dataplus._M_p,&local_221);
        local_1f0.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
        ;
        local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x145;
        local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 1;
        iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)local_1a0,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
            &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
        std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_220.m_message._M_dataplus._M_p,
                        local_220.m_message.field_2._M_allocated_capacity + 1);
      }
      iuutil::StrInHelper::Assertion<char[4],std::__cxx11::string>
                (&local_220,(StrInHelper *)"\"tes\"","str","tes",(char (*) [4])local_1c0,in_R9);
      if (local_220.m_result == false) {
        memset((iu_global_format_stringstream *)local_1a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,local_220.m_message._M_dataplus._M_p,&local_221);
        local_1f0.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
        ;
        local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x146;
        local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
        iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)local_1a0,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
            &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
        std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_220.m_message._M_dataplus._M_p,
                        local_220.m_message.field_2._M_allocated_capacity + 1);
      }
      iuutil::StrInHelper::Assertion<char[4],std::__cxx11::string>
                (&local_220,(StrInHelper *)"\"tes\"","str","tes",(char (*) [4])local_1c0,in_R9);
      if (local_220.m_result == false) {
        memset((iu_global_format_stringstream *)local_1a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,local_220.m_message._M_dataplus._M_p,&local_221);
        local_1f0.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
        ;
        local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x147;
        local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
        iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)local_1a0,false);
        goto LAB_0013b7f9;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_message._M_dataplus._M_p == paVar1) goto LAB_0013b649;
  }
  operator_delete(local_220.m_message._M_dataplus._M_p,
                  local_220.m_message.field_2._M_allocated_capacity + 1);
LAB_0013b649:
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  return;
}

Assistant:

IUTEST(AssertionTest, STRIN)
{
    const char test[] = "test";
    ::std::string str = test;
    IUTEST_ASSERT_STRIN("tes", test);
    IUTEST_EXPECT_STRIN("tes", test);
    IUTEST_INFORM_STRIN("tes", test);
    IUTEST_ASSUME_STRIN("tes", test);

    IUTEST_ASSERT_STRIN("test", test);
    IUTEST_EXPECT_STRIN("test", test);
    IUTEST_INFORM_STRIN("test", test);
    IUTEST_ASSUME_STRIN("test", test);

    IUTEST_ASSERT_STRIN("tes", str);
    IUTEST_EXPECT_STRIN("tes", str);
    IUTEST_INFORM_STRIN("tes", str);
    IUTEST_ASSUME_STRIN("tes", str);
}